

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijectionmap.h
# Opt level: O0

void __thiscall
Common::SerialBijectionMap<unsigned_long>::SerialBijectionMap
          (SerialBijectionMap<unsigned_long> *this)

{
  SerialBijectionMap<unsigned_long> *this_local;
  
  this->currcount = 0;
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::map(&this->keymap);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->data);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque(&this->destroyable);
  return;
}

Assistant:

explicit SerialBijectionMap() {}